

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

void __thiscall
CCoinsViewCache::AddCoin
          (CCoinsViewCache *this,COutPoint *outpoint,Coin *coin,bool possible_overwrite)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  size_t sVar4;
  logic_error *this_00;
  pointer ppVar5;
  uint8_t flags;
  byte in_CL;
  CoinsCachePair *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  bool fresh;
  bool inserted;
  iterator it;
  CoinsCachePair *in_stack_ffffffffffffff38;
  COutPoint *in_stack_ffffffffffffff40;
  Coin *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  *in_stack_ffffffffffffff58;
  byte local_72;
  byte local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = Coin::IsSpent((Coin *)in_stack_ffffffffffffff38);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!coin.IsSpent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/coins.cpp"
                  ,0x47,"void CCoinsViewCache::AddCoin(const COutPoint &, Coin &&, bool)");
  }
  bVar2 = CScript::IsUnspendable((CScript *)in_stack_ffffffffffffff40);
  if (!bVar2) {
    std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
    _Node_iterator((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
                   in_stack_ffffffffffffff38);
    std::forward_as_tuple<COutPoint_const&>(in_stack_ffffffffffffff40);
    std::
    unordered_map<COutPoint,CCoinsCacheEntry,SaltedOutpointHasher,std::equal_to<COutPoint>,PoolAllocator<std::pair<COutPoint_const,CCoinsCacheEntry>,144ul,8ul>>
    ::emplace<std::piecewise_construct_t_const&,std::tuple<COutPoint_const&>,std::tuple<>>
              (in_stack_ffffffffffffff58,
               (piecewise_construct_t *)
               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               (tuple<const_COutPoint_&> *)in_stack_ffffffffffffff48,
               (tuple<> *)in_stack_ffffffffffffff40);
    std::
    tie<std::__detail::_Node_iterator<std::pair<COutPoint_const,CCoinsCacheEntry>,false,false>,bool>
              ((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
               in_stack_ffffffffffffff40,(bool *)in_stack_ffffffffffffff38);
    std::
    tuple<std::__detail::_Node_iterator<std::pair<COutPoint_const,CCoinsCacheEntry>,false,false>&,bool&>
    ::operator=((tuple<std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>_&,_bool_&>
                 *)in_stack_ffffffffffffff58,
                (pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>,_bool>
                 *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    local_72 = 0;
    if ((local_21 & 1) == 0) {
      std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
      operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
                 in_stack_ffffffffffffff38);
      sVar4 = Coin::DynamicMemoryUsage((Coin *)in_stack_ffffffffffffff38);
      *(size_t *)(in_RDI + 0x1c0) = *(long *)(in_RDI + 0x1c0) - sVar4;
    }
    if ((in_CL & 1) == 0) {
      std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
      operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
                 in_stack_ffffffffffffff38);
      bVar2 = Coin::IsSpent((Coin *)in_stack_ffffffffffffff38);
      if (!bVar2) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_00,
                   "Attempted to overwrite an unspent coin (when possible_overwrite is false)");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        goto LAB_0080591c;
      }
      std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
      operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
                 in_stack_ffffffffffffff38);
      bVar2 = CCoinsCacheEntry::IsDirty((CCoinsCacheEntry *)in_stack_ffffffffffffff38);
      local_72 = (bVar2 ^ 0xffU) & 1;
    }
    std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
    operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
               in_stack_ffffffffffffff38);
    Coin::operator=(in_stack_ffffffffffffff48,(Coin *)in_RDX);
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>
                         *)in_stack_ffffffffffffff38);
    flags = (uint8_t)((ulong)&ppVar5->second >> 0x38);
    bVar3 = 0;
    if (local_72 != 0) {
      bVar3 = 2;
    }
    bVar3 = bVar3 | 1;
    std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
    operator*((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
              in_stack_ffffffffffffff38);
    CCoinsCacheEntry::AddFlags
              ((CCoinsCacheEntry *)CONCAT17(bVar3,in_stack_ffffffffffffff50),flags,in_RDX,
               in_stack_ffffffffffffff38);
    std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
    operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
               in_stack_ffffffffffffff38);
    sVar4 = Coin::DynamicMemoryUsage((Coin *)in_stack_ffffffffffffff38);
    *(size_t *)(in_RDI + 0x1c0) = sVar4 + *(long *)(in_RDI + 0x1c0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0080591c:
  __stack_chk_fail();
}

Assistant:

void CCoinsViewCache::AddCoin(const COutPoint &outpoint, Coin&& coin, bool possible_overwrite) {
    assert(!coin.IsSpent());
    if (coin.out.scriptPubKey.IsUnspendable()) return;
    CCoinsMap::iterator it;
    bool inserted;
    std::tie(it, inserted) = cacheCoins.emplace(std::piecewise_construct, std::forward_as_tuple(outpoint), std::tuple<>());
    bool fresh = false;
    if (!inserted) {
        cachedCoinsUsage -= it->second.coin.DynamicMemoryUsage();
    }
    if (!possible_overwrite) {
        if (!it->second.coin.IsSpent()) {
            throw std::logic_error("Attempted to overwrite an unspent coin (when possible_overwrite is false)");
        }
        // If the coin exists in this cache as a spent coin and is DIRTY, then
        // its spentness hasn't been flushed to the parent cache. We're
        // re-adding the coin to this cache now but we can't mark it as FRESH.
        // If we mark it FRESH and then spend it before the cache is flushed
        // we would remove it from this cache and would never flush spentness
        // to the parent cache.
        //
        // Re-adding a spent coin can happen in the case of a re-org (the coin
        // is 'spent' when the block adding it is disconnected and then
        // re-added when it is also added in a newly connected block).
        //
        // If the coin doesn't exist in the current cache, or is spent but not
        // DIRTY, then it can be marked FRESH.
        fresh = !it->second.IsDirty();
    }
    it->second.coin = std::move(coin);
    it->second.AddFlags(CCoinsCacheEntry::DIRTY | (fresh ? CCoinsCacheEntry::FRESH : 0), *it, m_sentinel);
    cachedCoinsUsage += it->second.coin.DynamicMemoryUsage();
    TRACE5(utxocache, add,
           outpoint.hash.data(),
           (uint32_t)outpoint.n,
           (uint32_t)it->second.coin.nHeight,
           (int64_t)it->second.coin.out.nValue,
           (bool)it->second.coin.IsCoinBase());
}